

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func_thread.cpp
# Opt level: O3

bool __thiscall FuncThread::RemoveFunc(FuncThread *this,string *name)

{
  iterator __position;
  _Rb_tree_header *p_Var1;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_(std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_(std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_(std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>)>_>_>_>
               ::find(&(this->_func_map)._M_t,name);
  p_Var1 = &(this->_func_map)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_(std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_(std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_(std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>)>_>_>_>
    ::_M_erase_aux(&(this->_func_map)._M_t,(const_iterator)__position._M_node);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return (_Rb_tree_header *)__position._M_node != p_Var1;
}

Assistant:

bool FuncThread::RemoveFunc(const std::string& name) {
    std::unique_lock<std::mutex> lock(_mutex);
    auto iter = _func_map.find(name);
    if (iter != _func_map.end()) {
        _func_map.erase(iter);
        return true;
    }
    return false;
}